

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::GenerateRuleFile
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *output)

{
  int iVar1;
  undefined4 extraout_var;
  char *dir;
  cmAlphaNum local_58;
  undefined1 local_21;
  string *local_20;
  string *output_local;
  cmGlobalGenerator *this_local;
  string *ruleFile;
  char *replace;
  
  local_21 = 0;
  local_20 = output;
  output_local = (string *)this;
  this_local = (cmGlobalGenerator *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_58,output);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&dir,".rule");
  cmStrCat<>(__return_storage_ptr__,&local_58,(cmAlphaNum *)&dir);
  iVar1 = (*this->_vptr_cmGlobalGenerator[0x15])();
  replace = (char *)CONCAT44(extraout_var,iVar1);
  if ((replace != (char *)0x0) && (*replace == '$')) {
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__,replace,"/CMakeFiles");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GenerateRuleFile(
  std::string const& output) const
{
  std::string ruleFile = cmStrCat(output, ".rule");
  const char* dir = this->GetCMakeCFGIntDir();
  if (dir && dir[0] == '$') {
    cmSystemTools::ReplaceString(ruleFile, dir, "/CMakeFiles");
  }
  return ruleFile;
}